

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O0

void __thiscall
avro::json::JsonGenerator::encodeBinary(JsonGenerator *this,uint8_t *bytes,size_t len)

{
  JsonGenerator *in_RCX;
  long in_RDX;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  JsonGenerator *in_RSI;
  JsonGenerator *in_RDI;
  uint8_t *e;
  JsonGenerator *in_stack_ffffffffffffffe0;
  JsonGenerator *this_00;
  JsonGenerator *local_10;
  
  sep(in_stack_ffffffffffffffe0);
  StreamWriter::write(&in_RDI->out_,0x22,__buf,(size_t)in_RCX);
  this_00 = (JsonGenerator *)((long)&(in_RSI->out_).out_ + in_RDX);
  __buf_00 = extraout_RDX;
  local_10 = in_RSI;
  while (local_10 != this_00) {
    local_10 = (JsonGenerator *)((long)&(local_10->out_).out_ + 1);
    in_RCX = local_10;
    escapeCtl(this_00,(char)((ulong)in_RDI >> 0x38));
    __buf_00 = extraout_RDX_00;
  }
  StreamWriter::write(&in_RDI->out_,0x22,__buf_00,(size_t)in_RCX);
  sep2(in_RDI);
  return;
}

Assistant:

void encodeBinary(const uint8_t* bytes, size_t len) {
        sep();
        out_.write('"');
        const uint8_t* e = bytes + len;
        while (bytes != e) {
            escapeCtl(*bytes++);
        }
        out_.write('"');
        sep2();
    }